

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::option_requires_argument_exception::option_requires_argument_exception
          (option_requires_argument_exception *this,string *option)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *option_local;
  option_requires_argument_exception *this_local;
  
  local_18 = option;
  option_local = (string *)this;
  std::operator+(&local_98,"Option ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::LQUOTE_abi_cxx11_);
  std::operator+(&local_78,&local_98,local_18);
  std::operator+(&local_58,&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (anonymous_namespace)::RQUOTE_abi_cxx11_);
  std::operator+(&local_38,&local_58," requires an argument");
  OptionParseException::OptionParseException(&this->super_OptionParseException,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  *(undefined ***)&(this->super_OptionParseException).super_OptionException =
       &PTR__option_requires_argument_exception_001964e8;
  return;
}

Assistant:

option_requires_argument_exception(const std::string& option)
    : OptionParseException(
        "Option " + LQUOTE + option + RQUOTE + " requires an argument"
      )
    {
    }